

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.h
# Opt level: O1

void __thiscall CMU462::HalfedgeMesh::assignSubdivisionIndices(HalfedgeMesh *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  p_Var1 = (_List_node_base *)0x0;
  for (p_Var2 = (this->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->vertices; p_Var2 = p_Var2->_M_next) {
    p_Var2[6]._M_next = p_Var1;
    p_Var1 = (_List_node_base *)((long)&p_Var1->_M_next + 1);
  }
  for (p_Var2 = (this->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl.
                _M_node.super__List_node_base._M_next; p_Var2 != (_List_node_base *)&this->edges;
      p_Var2 = p_Var2->_M_next) {
    p_Var2[3]._M_next = p_Var1;
    p_Var1 = (_List_node_base *)((long)&p_Var1->_M_next + 1);
  }
  for (p_Var2 = (this->faces).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl.
                _M_node.super__List_node_base._M_next; p_Var2 != (_List_node_base *)&this->faces;
      p_Var2 = p_Var2->_M_next) {
    p_Var2[1]._M_prev = p_Var1;
    p_Var1 = (_List_node_base *)((long)&p_Var1->_M_next + 1);
  }
  return;
}

Assistant:

VertexIter verticesBegin() { return vertices.begin(); }